

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

void Mio_LibraryShortNames(Mio_Library_t *pLib)

{
  uint uVar1;
  char *pcVar2;
  int local_2740;
  int nDigits;
  int i;
  int c;
  Mio_Pin_t *pPin;
  Mio_Gate_t *pGate;
  char Buffer [10000];
  Mio_Library_t *pLib_local;
  
  uVar1 = Mio_LibraryReadGateNum(pLib);
  uVar1 = Abc_Base10Log(uVar1);
  for (pPin = (Mio_Pin_t *)Mio_LibraryReadGates(pLib); pPin != (Mio_Pin_t *)0x0;
      pPin = (Mio_Pin_t *)Mio_GateReadNext((Mio_Gate_t *)pPin)) {
    if (pPin->pName != (char *)0x0) {
      free(pPin->pName);
      pPin->pName = (char *)0x0;
    }
    sprintf((char *)&pGate,"g%0*d",(ulong)uVar1);
    pcVar2 = Abc_UtilStrsav((char *)&pGate);
    pPin->pName = pcVar2;
    Mio_LibraryShortFormula((Mio_Gate_t *)pPin,(char *)pPin->dLoadInput,(char *)&pGate);
    if (pPin->dLoadInput != 0.0) {
      free((void *)pPin->dLoadInput);
      pPin->dLoadInput = 0.0;
    }
    pcVar2 = Abc_UtilStrsav((char *)&pGate);
    pPin->dLoadInput = (double)pcVar2;
    local_2740 = 0;
    for (_i = Mio_GateReadPins((Mio_Gate_t *)pPin); _i != (Mio_Pin_t *)0x0; _i = Mio_PinReadNext(_i)
        ) {
      if (_i->pName != (char *)0x0) {
        free(_i->pName);
        _i->pName = (char *)0x0;
      }
      sprintf((char *)&pGate,"%c",(ulong)(local_2740 + 0x61));
      pcVar2 = Abc_UtilStrsav((char *)&pGate);
      _i->pName = pcVar2;
      local_2740 = local_2740 + 1;
    }
    if (pPin->dDelayBlockRise != 0.0) {
      free((void *)pPin->dDelayBlockRise);
      pPin->dDelayBlockRise = 0.0;
    }
    sprintf((char *)&pGate,"z");
    pcVar2 = Abc_UtilStrsav((char *)&pGate);
    pPin->dDelayBlockRise = (double)pcVar2;
  }
  Mio_LibraryHashGates(pLib);
  pcVar2 = pLib->pName;
  uVar1 = Mio_LibraryReadGateNum(pLib);
  printf("Renaming library \"%s\" into \"%s%d\".\n",pcVar2,"lib",(ulong)uVar1);
  if (pLib->pName != (char *)0x0) {
    free(pLib->pName);
    pLib->pName = (char *)0x0;
  }
  uVar1 = Mio_LibraryReadGateNum(pLib);
  sprintf((char *)&pGate,"lib%d",(ulong)uVar1);
  pcVar2 = Abc_UtilStrsav((char *)&pGate);
  pLib->pName = pcVar2;
  return;
}

Assistant:

void Mio_LibraryShortNames( Mio_Library_t * pLib )
{
    char Buffer[10000];
    Mio_Gate_t * pGate; Mio_Pin_t * pPin;
    int c = 0, i, nDigits = Abc_Base10Log( Mio_LibraryReadGateNum(pLib) );
    // itereate through classes
    Mio_LibraryForEachGate( pLib, pGate )
    {
        ABC_FREE( pGate->pName );
        sprintf( Buffer, "g%0*d", nDigits, ++c );
        pGate->pName = Abc_UtilStrsav( Buffer );
        // update formula
        Mio_LibraryShortFormula( pGate, pGate->pForm, Buffer );
        ABC_FREE( pGate->pForm );
        pGate->pForm = Abc_UtilStrsav( Buffer );
        // pin names
        i = 0;
        Mio_GateForEachPin( pGate, pPin )
        {
            ABC_FREE( pPin->pName );
            sprintf( Buffer, "%c", 'a'+i );
            pPin->pName = Abc_UtilStrsav( Buffer );
            i++;
        }
        // output pin
        ABC_FREE( pGate->pOutName );
        sprintf( Buffer, "z" );
        pGate->pOutName = Abc_UtilStrsav( Buffer );
    }
    Mio_LibraryHashGates( pLib );
    // update library name
    printf( "Renaming library \"%s\" into \"%s%d\".\n", pLib->pName, "lib", Mio_LibraryReadGateNum(pLib) );
    ABC_FREE( pLib->pName );
    sprintf( Buffer, "lib%d", Mio_LibraryReadGateNum(pLib) );
    pLib->pName = Abc_UtilStrsav( Buffer );
}